

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O3

void __thiscall minibag::Bag::swap(Bag *this,Bag *other)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  BagMode BVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  pointer pCVar7;
  Buffer *pBVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  TimeBase<miniros::Time,_miniros::Duration> TVar11;
  TimeBase<miniros::Time,_miniros::Duration> TVar12;
  TimeBase<miniros::Time,_miniros::Duration> TVar13;
  pointer pCVar14;
  pointer pCVar15;
  pointer pCVar16;
  CompressionType CVar17;
  int iVar18;
  CompressionType CVar19;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *pmVar20;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  BVar4 = this->mode_;
  this->mode_ = other->mode_;
  other->mode_ = BVar4;
  ChunkedFile::swap(&this->file_,&other->file_);
  CVar17 = other->compression_;
  iVar18 = this->version_;
  CVar19 = this->compression_;
  this->version_ = other->version_;
  this->compression_ = CVar17;
  other->version_ = iVar18;
  other->compression_ = CVar19;
  uVar5 = this->chunk_threshold_;
  this->chunk_threshold_ = other->chunk_threshold_;
  other->chunk_threshold_ = uVar5;
  uVar5 = this->bag_revision_;
  this->bag_revision_ = other->bag_revision_;
  other->bag_revision_ = uVar5;
  uVar6 = this->file_size_;
  this->file_size_ = other->file_size_;
  other->file_size_ = uVar6;
  uVar6 = this->file_header_pos_;
  this->file_header_pos_ = other->file_header_pos_;
  other->file_header_pos_ = uVar6;
  uVar6 = this->index_data_pos_;
  this->index_data_pos_ = other->index_data_pos_;
  other->index_data_pos_ = uVar6;
  uVar5 = this->connection_count_;
  this->connection_count_ = other->connection_count_;
  other->connection_count_ = uVar5;
  uVar5 = this->chunk_count_;
  this->chunk_count_ = other->chunk_count_;
  other->chunk_count_ = uVar5;
  bVar3 = this->chunk_open_;
  this->chunk_open_ = other->chunk_open_;
  other->chunk_open_ = bVar3;
  uVar6 = (this->curr_chunk_info_).pos;
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  TVar11 = (this->curr_chunk_info_).start_time.super_TimeBase<miniros::Time,_miniros::Duration>;
  TVar12 = (this->curr_chunk_info_).end_time.super_TimeBase<miniros::Time,_miniros::Duration>;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent =
       (this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_parent;
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    pmVar20 = (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)&local_60;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  else {
    p_Var1 = &(this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color =
         (this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header.
         _M_color;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         (this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header.
         _M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         (this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header.
         _M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    pmVar20 = &(this->curr_chunk_info_).connection_counts;
    local_60._M_impl.super__Rb_tree_header._M_node_count =
         (this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    (this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    (this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = &p_Var1->_M_header;
    (this->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = &p_Var1->_M_header;
  }
  (pmVar20->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->curr_chunk_info_).pos = (other->curr_chunk_info_).pos;
  TVar13 = (other->curr_chunk_info_).end_time.super_TimeBase<miniros::Time,_miniros::Duration>;
  (this->curr_chunk_info_).start_time.super_TimeBase<miniros::Time,_miniros::Duration> =
       (other->curr_chunk_info_).start_time.super_TimeBase<miniros::Time,_miniros::Duration>;
  (this->curr_chunk_info_).end_time.super_TimeBase<miniros::Time,_miniros::Duration> = TVar13;
  pmVar20 = &(other->curr_chunk_info_).connection_counts;
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::operator=(&(this->curr_chunk_info_).connection_counts,pmVar20);
  (other->curr_chunk_info_).start_time.super_TimeBase<miniros::Time,_miniros::Duration> = TVar11;
  (other->curr_chunk_info_).end_time.super_TimeBase<miniros::Time,_miniros::Duration> = TVar12;
  (other->curr_chunk_info_).pos = uVar6;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear(&pmVar20->_M_t);
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (other->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (other->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (other->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (other->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(other->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_header;
    (other->curr_chunk_info_).connection_counts._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_60);
  uVar6 = this->curr_chunk_data_pos_;
  this->curr_chunk_data_pos_ = other->curr_chunk_data_pos_;
  other->curr_chunk_data_pos_ = uVar6;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::swap(&(this->topic_connection_ids_)._M_t,&(other->topic_connection_ids_)._M_t);
  std::_Rb_tree<$6cc845ac$>::swap
            (&(this->header_connection_ids_)._M_t,&(other->header_connection_ids_)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
  ::swap(&(this->connections_)._M_t,&(other->connections_)._M_t);
  pCVar7 = (this->chunks_).
           super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pCVar14 = (other->chunks_).
            super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pCVar15 = (this->chunks_).
            super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar16 = (this->chunks_).
            super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->chunks_).super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (other->chunks_).super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->chunks_).super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = pCVar14;
  (this->chunks_).super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->chunks_).super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->chunks_).super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = pCVar15;
  (other->chunks_).super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = pCVar16;
  (other->chunks_).super__Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pCVar7;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
  ::swap(&(this->connection_indexes_)._M_t,&(other->connection_indexes_)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
  ::swap(&(this->curr_chunk_connection_indexes_)._M_t,&(other->curr_chunk_connection_indexes_)._M_t)
  ;
  Buffer::swap(&this->header_buffer_,&other->header_buffer_);
  Buffer::swap(&this->record_buffer_,&other->record_buffer_);
  Buffer::swap(&this->chunk_buffer_,&other->chunk_buffer_);
  Buffer::swap(&this->decompress_buffer_,&other->decompress_buffer_);
  Buffer::swap(&this->outgoing_chunk_buffer_,&other->outgoing_chunk_buffer_);
  pBVar8 = this->current_buffer_;
  this->current_buffer_ = other->current_buffer_;
  other->current_buffer_ = pBVar8;
  uVar6 = this->decompressed_chunk_;
  this->decompressed_chunk_ = other->decompressed_chunk_;
  other->decompressed_chunk_ = uVar6;
  peVar9 = (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (other->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar9;
  p_Var10 = (other->encryptor_).
            super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (other->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var10;
  return;
}

Assistant:

void Bag::swap(Bag& other) {
    using std::swap;
    swap(mode_, other.mode_);
    swap(file_, other.file_);
    swap(version_, other.version_);
    swap(compression_, other.compression_);
    swap(chunk_threshold_, other.chunk_threshold_);
    swap(bag_revision_, other.bag_revision_);
    swap(file_size_, other.file_size_);
    swap(file_header_pos_, other.file_header_pos_);
    swap(index_data_pos_, other.index_data_pos_);
    swap(connection_count_, other.connection_count_);
    swap(chunk_count_, other.chunk_count_);
    swap(chunk_open_, other.chunk_open_);
    swap(curr_chunk_info_, other.curr_chunk_info_);
    swap(curr_chunk_data_pos_, other.curr_chunk_data_pos_);
    swap(topic_connection_ids_, other.topic_connection_ids_);
    swap(header_connection_ids_, other.header_connection_ids_);
    swap(connections_, other.connections_);
    swap(chunks_, other.chunks_);
    swap(connection_indexes_, other.connection_indexes_);
    swap(curr_chunk_connection_indexes_, other.curr_chunk_connection_indexes_);
    swap(header_buffer_, other.header_buffer_);
    swap(record_buffer_, other.record_buffer_);
    swap(chunk_buffer_, other.chunk_buffer_);
    swap(decompress_buffer_, other.decompress_buffer_);
    swap(outgoing_chunk_buffer_, other.outgoing_chunk_buffer_);
    swap(current_buffer_, other.current_buffer_);
    swap(decompressed_chunk_, other.decompressed_chunk_);
    swap(encryptor_, other.encryptor_);
}